

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadZero<wabt::interp::Simd<unsigned_long,(unsigned_char)2>,unsigned_long>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  RunResult RVar2;
  Value value;
  L val;
  ulong local_18;
  
  RVar1 = Load<unsigned_long>(this,instr,&local_18,out_trap);
  RVar2 = Trap;
  if (RVar1 == Ok) {
    RVar2 = Ok;
    value.field_0._8_8_ = 0;
    value.field_0.i64_ = local_18;
    Push(this,value);
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoSimdLoadZero(Instr instr, Trap::Ptr* out_trap) {
  using L = typename S::LaneType;
  L val;
  if (Load<L>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  std::fill(std::begin(result.v), std::end(result.v), 0);
  result[0] = val;
  Push(result);
  return RunResult::Ok;
}